

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

void __thiscall
leveldb::RecoveryTest::MakeLogFile
          (RecoveryTest *this,uint64_t lognum,SequenceNumber seq,Slice key,Slice val)

{
  undefined8 *puVar1;
  int line;
  char *pcVar2;
  WritableFile *file;
  Writer writer;
  WriteBatch batch;
  string fname;
  char local_c1;
  AssertHelper local_c0;
  undefined8 *local_b8;
  undefined1 local_b0 [8];
  WritableFile *local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  size_type sStack_98;
  undefined1 local_90 [32];
  Slice local_70;
  WriteBatch local_60;
  string local_40;
  
  local_70.size_ = key.size_;
  local_70.data_ = key.data_;
  LogFileName(&local_40,&this->dbname_,lognum);
  (*this->env_->_vptr_Env[4])(&local_60,this->env_,&local_40,&local_a8);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_90,(char *)&local_c0
             ,(Status *)"env_->NewWritableFile(fname, &file)");
  if ((long *)local_60.rep_._M_dataplus._M_p != (long *)0x0) {
    operator_delete__(local_60.rep_._M_dataplus._M_p);
  }
  if (local_90[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_90._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_90._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((long *)local_60.rep_._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_60.rep_._M_dataplus._M_p + 8))();
    }
    if ((undefined8 *)local_90._8_8_ != (undefined8 *)0x0) {
      if (*(undefined8 **)local_90._8_8_ != (undefined8 *)(local_90._8_8_ + 0x10)) {
        operator_delete(*(undefined8 **)local_90._8_8_);
      }
      operator_delete((void *)local_90._8_8_);
    }
    goto LAB_0010fa85;
  }
  if ((undefined8 *)local_90._8_8_ != (undefined8 *)0x0) {
    if (*(undefined8 **)local_90._8_8_ != (undefined8 *)(local_90._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_90._8_8_);
    }
    operator_delete((void *)local_90._8_8_);
  }
  log::Writer::Writer((Writer *)local_90,local_a8);
  WriteBatch::WriteBatch(&local_60);
  WriteBatch::Put(&local_60,&local_70,&val);
  WriteBatchInternal::SetSequence(&local_60,seq);
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_60.rep_._M_dataplus._M_p;
  sStack_98 = local_60.rep_._M_string_length;
  log::Writer::AddRecord((Writer *)local_b0,(Slice *)local_90);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,&local_c1,
             (Status *)"writer.AddRecord(WriteBatchInternal::Contents(&batch))");
  if (local_b0 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_b0);
  }
  puVar1 = local_b8;
  if (local_c0.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_a0);
    if (local_b8 == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (char *)*local_b8;
    }
    line = 0x96;
LAB_0010fa23:
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,line,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b0,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b0);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
    if (local_b8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b8 != local_b8 + 2) {
        operator_delete((undefined8 *)*local_b8);
      }
      operator_delete(local_b8);
    }
  }
  else {
    if (local_b8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b8 != local_b8 + 2) {
        operator_delete((undefined8 *)*local_b8);
      }
      operator_delete(puVar1);
    }
    (*local_a8->_vptr_WritableFile[4])(&local_a0);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&local_c0,local_b0,
               (Status *)"file->Flush()");
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(local_a0._M_head_impl);
    }
    if (local_c0.data_._0_1_ == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
      testing::Message::Message((Message *)&local_a0);
      if (local_b8 == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = (char *)*local_b8;
      }
      line = 0x97;
      goto LAB_0010fa23;
    }
    if (local_b8 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_b8 != local_b8 + 2) {
        operator_delete((undefined8 *)*local_b8);
      }
      operator_delete(local_b8);
    }
    if (local_a8 != (WritableFile *)0x0) {
      (*local_a8->_vptr_WritableFile[1])();
    }
  }
  WriteBatch::~WriteBatch(&local_60);
  log::Writer::~Writer((Writer *)local_90);
LAB_0010fa85:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void MakeLogFile(uint64_t lognum, SequenceNumber seq, Slice key, Slice val) {
    std::string fname = LogFileName(dbname_, lognum);
    WritableFile* file;
    ASSERT_LEVELDB_OK(env_->NewWritableFile(fname, &file));
    log::Writer writer(file);
    WriteBatch batch;
    batch.Put(key, val);
    WriteBatchInternal::SetSequence(&batch, seq);
    ASSERT_LEVELDB_OK(writer.AddRecord(WriteBatchInternal::Contents(&batch)));
    ASSERT_LEVELDB_OK(file->Flush());
    delete file;
  }